

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O0

char * doctest::detail::getAssertString(Enum val)

{
  char *pcStack_10;
  Enum val_local;
  
  if (val == DT_WARN) {
    pcStack_10 = "WARN";
  }
  else if (val == DT_CHECK) {
    pcStack_10 = "CHECK";
  }
  else if (val == DT_REQUIRE) {
    pcStack_10 = "REQUIRE";
  }
  else if (val == DT_WARN_THROWS) {
    pcStack_10 = "WARN_THROWS";
  }
  else if (val == DT_CHECK_THROWS) {
    pcStack_10 = "CHECK_THROWS";
  }
  else if (val == DT_REQUIRE_THROWS) {
    pcStack_10 = "REQUIRE_THROWS";
  }
  else if (val == DT_WARN_THROWS_AS) {
    pcStack_10 = "WARN_THROWS_AS";
  }
  else if (val == DT_CHECK_THROWS_AS) {
    pcStack_10 = "CHECK_THROWS_AS";
  }
  else if (val == DT_REQUIRE_THROWS_AS) {
    pcStack_10 = "REQUIRE_THROWS_AS";
  }
  else if (val == DT_WARN_NOTHROW) {
    pcStack_10 = "WARN_NOTHROW";
  }
  else if (val == DT_CHECK_NOTHROW) {
    pcStack_10 = "CHECK_NOTHROW";
  }
  else if (val == DT_REQUIRE_NOTHROW) {
    pcStack_10 = "REQUIRE_NOTHROW";
  }
  else if (val == DT_WARN_FALSE) {
    pcStack_10 = "WARN_FALSE";
  }
  else if (val == DT_CHECK_FALSE) {
    pcStack_10 = "CHECK_FALSE";
  }
  else if (val == DT_REQUIRE_FALSE) {
    pcStack_10 = "REQUIRE_FALSE";
  }
  else if (val == DT_WARN_UNARY) {
    pcStack_10 = "WARN_UNARY";
  }
  else if (val == DT_CHECK_UNARY) {
    pcStack_10 = "CHECK_UNARY";
  }
  else if (val == DT_REQUIRE_UNARY) {
    pcStack_10 = "REQUIRE_UNARY";
  }
  else if (val == DT_FAST_WARN_UNARY) {
    pcStack_10 = "FAST_WARN_UNARY";
  }
  else if (val == DT_FAST_CHECK_UNARY) {
    pcStack_10 = "FAST_CHECK_UNARY";
  }
  else if (val == DT_FAST_REQUIRE_UNARY) {
    pcStack_10 = "FAST_REQUIRE_UNARY";
  }
  else if (val == DT_WARN_UNARY_FALSE) {
    pcStack_10 = "WARN_UNARY_FALSE";
  }
  else if (val == DT_CHECK_UNARY_FALSE) {
    pcStack_10 = "CHECK_UNARY_FALSE";
  }
  else if (val == DT_REQUIRE_UNARY_FALSE) {
    pcStack_10 = "REQUIRE_UNARY_FALSE";
  }
  else if (val == DT_FAST_WARN_UNARY_FALSE) {
    pcStack_10 = "FAST_WARN_UNARY_FALSE";
  }
  else if (val == DT_FAST_CHECK_UNARY_FALSE) {
    pcStack_10 = "FAST_CHECK_UNARY_FALSE";
  }
  else if (val == DT_FAST_REQUIRE_UNARY_FALSE) {
    pcStack_10 = "FAST_REQUIRE_UNARY_FALSE";
  }
  else if (val == DT_WARN_EQ) {
    pcStack_10 = "WARN_EQ";
  }
  else if (val == DT_CHECK_EQ) {
    pcStack_10 = "CHECK_EQ";
  }
  else if (val == DT_REQUIRE_EQ) {
    pcStack_10 = "REQUIRE_EQ";
  }
  else if (val == DT_FAST_WARN_EQ) {
    pcStack_10 = "FAST_WARN_EQ";
  }
  else if (val == DT_FAST_CHECK_EQ) {
    pcStack_10 = "FAST_CHECK_EQ";
  }
  else if (val == DT_FAST_REQUIRE_EQ) {
    pcStack_10 = "FAST_REQUIRE_EQ";
  }
  else if (val == DT_WARN_NE) {
    pcStack_10 = "WARN_NE";
  }
  else if (val == DT_CHECK_NE) {
    pcStack_10 = "CHECK_NE";
  }
  else if (val == DT_REQUIRE_NE) {
    pcStack_10 = "REQUIRE_NE";
  }
  else if (val == DT_FAST_WARN_NE) {
    pcStack_10 = "FAST_WARN_NE";
  }
  else if (val == DT_FAST_CHECK_NE) {
    pcStack_10 = "FAST_CHECK_NE";
  }
  else if (val == DT_FAST_REQUIRE_NE) {
    pcStack_10 = "FAST_REQUIRE_NE";
  }
  else if (val == DT_WARN_LT) {
    pcStack_10 = "WARN_LT";
  }
  else if (val == DT_CHECK_LT) {
    pcStack_10 = "CHECK_LT";
  }
  else if (val == DT_REQUIRE_LT) {
    pcStack_10 = "REQUIRE_LT";
  }
  else if (val == DT_FAST_WARN_LT) {
    pcStack_10 = "FAST_WARN_LT";
  }
  else if (val == DT_FAST_CHECK_LT) {
    pcStack_10 = "FAST_CHECK_LT";
  }
  else if (val == DT_FAST_REQUIRE_LT) {
    pcStack_10 = "FAST_REQUIRE_LT";
  }
  else if (val == DT_WARN_GT) {
    pcStack_10 = "WARN_GT";
  }
  else if (val == DT_CHECK_GT) {
    pcStack_10 = "CHECK_GT";
  }
  else if (val == DT_REQUIRE_GT) {
    pcStack_10 = "REQUIRE_GT";
  }
  else if (val == DT_FAST_WARN_GT) {
    pcStack_10 = "FAST_WARN_GT";
  }
  else if (val == DT_FAST_CHECK_GT) {
    pcStack_10 = "FAST_CHECK_GT";
  }
  else if (val == DT_FAST_REQUIRE_GT) {
    pcStack_10 = "FAST_REQUIRE_GT";
  }
  else if (val == DT_WARN_GE) {
    pcStack_10 = "WARN_GE";
  }
  else if (val == DT_CHECK_GE) {
    pcStack_10 = "CHECK_GE";
  }
  else if (val == DT_REQUIRE_GE) {
    pcStack_10 = "REQUIRE_GE";
  }
  else if (val == DT_FAST_WARN_GE) {
    pcStack_10 = "FAST_WARN_GE";
  }
  else if (val == DT_FAST_CHECK_GE) {
    pcStack_10 = "FAST_CHECK_GE";
  }
  else if (val == DT_FAST_REQUIRE_GE) {
    pcStack_10 = "FAST_REQUIRE_GE";
  }
  else if (val == DT_WARN_LE) {
    pcStack_10 = "WARN_LE";
  }
  else if (val == DT_CHECK_LE) {
    pcStack_10 = "CHECK_LE";
  }
  else if (val == DT_REQUIRE_LE) {
    pcStack_10 = "REQUIRE_LE";
  }
  else if (val == DT_FAST_WARN_LE) {
    pcStack_10 = "FAST_WARN_LE";
  }
  else if (val == DT_FAST_CHECK_LE) {
    pcStack_10 = "FAST_CHECK_LE";
  }
  else if (val == DT_FAST_REQUIRE_LE) {
    pcStack_10 = "FAST_REQUIRE_LE";
  }
  else {
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char* getAssertString(assertType::Enum val) {
        switch(val) {
            // clang-format off
            case assertType::DT_WARN                    : return "WARN";
            case assertType::DT_CHECK                   : return "CHECK";
            case assertType::DT_REQUIRE                 : return "REQUIRE";

            case assertType::DT_WARN_FALSE              : return "WARN_FALSE";
            case assertType::DT_CHECK_FALSE             : return "CHECK_FALSE";
            case assertType::DT_REQUIRE_FALSE           : return "REQUIRE_FALSE";

            case assertType::DT_WARN_THROWS             : return "WARN_THROWS";
            case assertType::DT_CHECK_THROWS            : return "CHECK_THROWS";
            case assertType::DT_REQUIRE_THROWS          : return "REQUIRE_THROWS";

            case assertType::DT_WARN_THROWS_AS          : return "WARN_THROWS_AS";
            case assertType::DT_CHECK_THROWS_AS         : return "CHECK_THROWS_AS";
            case assertType::DT_REQUIRE_THROWS_AS       : return "REQUIRE_THROWS_AS";

            case assertType::DT_WARN_NOTHROW            : return "WARN_NOTHROW";
            case assertType::DT_CHECK_NOTHROW           : return "CHECK_NOTHROW";
            case assertType::DT_REQUIRE_NOTHROW         : return "REQUIRE_NOTHROW";

            case assertType::DT_WARN_EQ                 : return "WARN_EQ";
            case assertType::DT_CHECK_EQ                : return "CHECK_EQ";
            case assertType::DT_REQUIRE_EQ              : return "REQUIRE_EQ";
            case assertType::DT_WARN_NE                 : return "WARN_NE";
            case assertType::DT_CHECK_NE                : return "CHECK_NE";
            case assertType::DT_REQUIRE_NE              : return "REQUIRE_NE";
            case assertType::DT_WARN_GT                 : return "WARN_GT";
            case assertType::DT_CHECK_GT                : return "CHECK_GT";
            case assertType::DT_REQUIRE_GT              : return "REQUIRE_GT";
            case assertType::DT_WARN_LT                 : return "WARN_LT";
            case assertType::DT_CHECK_LT                : return "CHECK_LT";
            case assertType::DT_REQUIRE_LT              : return "REQUIRE_LT";
            case assertType::DT_WARN_GE                 : return "WARN_GE";
            case assertType::DT_CHECK_GE                : return "CHECK_GE";
            case assertType::DT_REQUIRE_GE              : return "REQUIRE_GE";
            case assertType::DT_WARN_LE                 : return "WARN_LE";
            case assertType::DT_CHECK_LE                : return "CHECK_LE";
            case assertType::DT_REQUIRE_LE              : return "REQUIRE_LE";

            case assertType::DT_WARN_UNARY              : return "WARN_UNARY";
            case assertType::DT_CHECK_UNARY             : return "CHECK_UNARY";
            case assertType::DT_REQUIRE_UNARY           : return "REQUIRE_UNARY";
            case assertType::DT_WARN_UNARY_FALSE        : return "WARN_UNARY_FALSE";
            case assertType::DT_CHECK_UNARY_FALSE       : return "CHECK_UNARY_FALSE";
            case assertType::DT_REQUIRE_UNARY_FALSE     : return "REQUIRE_UNARY_FALSE";

            case assertType::DT_FAST_WARN_EQ            : return "FAST_WARN_EQ";
            case assertType::DT_FAST_CHECK_EQ           : return "FAST_CHECK_EQ";
            case assertType::DT_FAST_REQUIRE_EQ         : return "FAST_REQUIRE_EQ";
            case assertType::DT_FAST_WARN_NE            : return "FAST_WARN_NE";
            case assertType::DT_FAST_CHECK_NE           : return "FAST_CHECK_NE";
            case assertType::DT_FAST_REQUIRE_NE         : return "FAST_REQUIRE_NE";
            case assertType::DT_FAST_WARN_GT            : return "FAST_WARN_GT";
            case assertType::DT_FAST_CHECK_GT           : return "FAST_CHECK_GT";
            case assertType::DT_FAST_REQUIRE_GT         : return "FAST_REQUIRE_GT";
            case assertType::DT_FAST_WARN_LT            : return "FAST_WARN_LT";
            case assertType::DT_FAST_CHECK_LT           : return "FAST_CHECK_LT";
            case assertType::DT_FAST_REQUIRE_LT         : return "FAST_REQUIRE_LT";
            case assertType::DT_FAST_WARN_GE            : return "FAST_WARN_GE";
            case assertType::DT_FAST_CHECK_GE           : return "FAST_CHECK_GE";
            case assertType::DT_FAST_REQUIRE_GE         : return "FAST_REQUIRE_GE";
            case assertType::DT_FAST_WARN_LE            : return "FAST_WARN_LE";
            case assertType::DT_FAST_CHECK_LE           : return "FAST_CHECK_LE";
            case assertType::DT_FAST_REQUIRE_LE         : return "FAST_REQUIRE_LE";

            case assertType::DT_FAST_WARN_UNARY         : return "FAST_WARN_UNARY";
            case assertType::DT_FAST_CHECK_UNARY        : return "FAST_CHECK_UNARY";
            case assertType::DT_FAST_REQUIRE_UNARY      : return "FAST_REQUIRE_UNARY";
            case assertType::DT_FAST_WARN_UNARY_FALSE   : return "FAST_WARN_UNARY_FALSE";
            case assertType::DT_FAST_CHECK_UNARY_FALSE  : return "FAST_CHECK_UNARY_FALSE";
            case assertType::DT_FAST_REQUIRE_UNARY_FALSE: return "FAST_REQUIRE_UNARY_FALSE";
                // clang-format on
        }
        return "";
    }